

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codafind.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  char *local_38;
  
  verbosity = 0;
  if (argc != 1) {
    pcVar2 = argv[1];
    cVar1 = *pcVar2;
    if (cVar1 == '-') {
      if (((pcVar2[1] != 'h') || (pcVar2[2] != '\0')) &&
         (iVar4 = strcmp(pcVar2,"--help"), iVar4 != 0)) {
        if ((pcVar2[1] != 'v') || (pcVar2[2] != '\0')) goto LAB_0010148a;
LAB_0010164d:
        print_version();
        goto LAB_00101652;
      }
    }
    else {
      iVar4 = strcmp(pcVar2,"--help");
      if (iVar4 != 0) {
LAB_0010148a:
        iVar4 = strcmp(pcVar2,"--version");
        if (iVar4 == 0) goto LAB_0010164d;
        if (((argc < 3 || cVar1 != '-') || (pcVar2[1] != 'D')) || (pcVar2[2] != '\0')) {
          iVar4 = coda_set_definition_path_conditional(*argv,0,"../share/coda/definitions");
          iVar6 = 1;
          if (iVar4 != 0) goto LAB_00101668;
        }
        else {
          coda_set_definition_path(argv[2]);
          iVar6 = 3;
        }
        uVar5 = 1;
        if (iVar6 < argc) {
          local_38 = (char *)0x0;
          uVar5 = 1;
          do {
            pcVar2 = argv[iVar6];
            cVar1 = *pcVar2;
            if (cVar1 == '-') {
              if (((pcVar2[1] == 'd') && (pcVar2[2] == '\0')) ||
                 (iVar4 = strcmp(pcVar2,"--disable_conversions"), iVar4 == 0)) {
LAB_001015a5:
                uVar5 = 0;
                iVar4 = iVar6;
                pcVar3 = local_38;
              }
              else {
                if ((pcVar2[1] != 'f') || (pcVar2[2] != '\0')) goto LAB_00101552;
LAB_00101565:
                iVar4 = iVar6 + 1;
                if ((argc <= iVar4) || (pcVar3 = argv[iVar4], *argv[iVar4] == '-'))
                goto LAB_00101579;
              }
            }
            else {
              iVar4 = strcmp(pcVar2,"--disable_conversions");
              if (iVar4 == 0) goto LAB_001015a5;
LAB_00101552:
              iVar4 = strcmp(pcVar2,"--filter");
              if (iVar4 == 0) goto LAB_00101565;
LAB_00101579:
              if (cVar1 == '-') {
                if (((pcVar2[1] != 'V') || (pcVar2[2] != '\0')) &&
                   (iVar4 = strcmp(pcVar2,"--verbosity"), iVar4 != 0)) {
                  main_cold_2();
                  goto LAB_00101646;
                }
              }
              else {
                iVar4 = strcmp(pcVar2,"--verbosity");
                if (iVar4 != 0) break;
              }
              verbosity = 1;
              iVar4 = iVar6;
              pcVar3 = local_38;
            }
            local_38 = pcVar3;
            iVar6 = iVar4 + 1;
          } while (iVar6 < argc);
        }
        else {
          local_38 = (char *)0x0;
        }
        if (argc - iVar6 == 0) {
          main_cold_5();
LAB_0010165e:
          main_cold_3();
        }
        else {
          iVar4 = coda_init();
          if (iVar4 != 0) goto LAB_0010165e;
          coda_set_option_perform_conversions(uVar5);
          iVar4 = coda_match_filefilter(local_38,argc - iVar6,argv + iVar6,callback,0);
          if (iVar4 == 0) {
            coda_done();
            return 0;
          }
        }
        main_cold_4();
LAB_00101668:
        main_cold_1();
        puts("Usage:");
        puts("    codafind [-D definitionpath] [<options>] <files|directories>");
        puts("        Match a filter on a series of files and/or recursively on all contents");
        puts("        of directories");
        putchar(10);
        puts("        Options:");
        puts("            -d, --disable_conversions");
        puts("                    do not perform unit/value conversions");
        puts("            -f, --filter \'<filter expression>\'");
        puts("                    restrict the output to data that matches the filter");
        puts("                    if no filter is provided codafind will find all files that");
        puts("                    can be opened with CODA");
        puts("            -V, --verbose");
        puts("                    show the match result for each file");
        putchar(10);
        puts("    codafind -h, --help");
        puts("        Show help (this text)");
        putchar(10);
        puts("    codafind -v, --version");
        puts("        Print the version number of CODA and exit");
        putchar(10);
        puts("    CODA will look for .codadef files using a definition path, which is a \':\'");
        puts("    separated (\';\' on Windows) list of paths to .codadef files and/or to");
        puts("    directories containing .codadef files.");
        puts("    By default the definition path is set to a single directory relative to");
        puts("    the tool location. A different definition path can be set via the");
        puts("    CODA_DEFINITION environment variable or via the -D option.");
        puts("    (the -D option overrides the environment variable setting).");
        iVar4 = putchar(10);
        return iVar4;
      }
    }
  }
LAB_00101646:
  print_help();
LAB_00101652:
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
    char *filter = NULL;
    int perform_conversions;
    int i;

    verbosity = 0;
    perform_conversions = 1;

    if (argc == 1 || strcmp(argv[1], "-h") == 0 || strcmp(argv[1], "--help") == 0)
    {
        print_help();
        exit(0);
    }

    if (strcmp(argv[1], "-v") == 0 || strcmp(argv[1], "--version") == 0)
    {
        print_version();
        exit(0);
    }

    i = 1;
    if (i + 1 < argc && strcmp(argv[i], "-D") == 0)
    {
        coda_set_definition_path(argv[i + 1]);
        i += 2;
    }
    else
    {
        const char *definition_path = "../share/" PACKAGE "/definitions";

        if (coda_set_definition_path_conditional(argv[0], NULL, definition_path) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }
    }

    while (i < argc)
    {
        if (strcmp(argv[i], "-d") == 0 || strcmp(argv[i], "--disable_conversions") == 0)
        {
            perform_conversions = 0;
        }
        else if ((strcmp(argv[i], "-f") == 0 || strcmp(argv[i], "--filter") == 0) &&
                 i + 1 < argc && argv[i + 1][0] != '-')
        {
            filter = argv[i + 1];
            i++;
        }
        else if (strcmp(argv[i], "-V") == 0 || strcmp(argv[i], "--verbosity") == 0)
        {
            verbosity = 1;
        }
        else if (argv[i][0] != '-')
        {
            /* assume all arguments from here on are files */
            break;
        }
        else
        {
            fprintf(stderr, "ERROR: invalid arguments\n");
            print_help();
            exit(1);
        }
        i++;
    }

    if (i == argc)
    {
        /* no files or directories provided */
        fprintf(stderr, "ERROR: invalid arguments\n");
        print_help();
        exit(1);
    }

    if (coda_init() != 0)
    {
        fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }

    coda_set_option_perform_conversions(perform_conversions);

    if (coda_match_filefilter(filter, argc - i, (const char **)&argv[i], &callback, NULL) != 0)
    {
        fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }

    coda_done();

    return 0;
}